

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMotorRotationAngle.h
# Opt level: O3

void __thiscall
chrono::ChLinkMotorRotationAngle::SetAngleFunction
          (ChLinkMotorRotationAngle *this,shared_ptr<chrono::ChFunction> *function)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_8;
  
  peVar1 = (function->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_8._M_pi =
       (function->super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
       _M_pi;
  if (local_8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_8._M_pi)->_M_use_count = (local_8._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_8._M_pi)->_M_use_count = (local_8._M_pi)->_M_use_count + 1;
    }
  }
  *(element_type **)(this + 0x250) = peVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 600),&local_8);
  if (local_8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_8._M_pi);
  }
  return;
}

Assistant:

void SetAngleFunction(const std::shared_ptr<ChFunction> function) { SetMotorFunction(function); }